

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O2

void __thiscall
Maze::printMatrix(Maze *this,
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 *Matrix)

{
  reference pvVar1;
  reference pvVar2;
  ostream *poVar3;
  int j;
  ulong __n;
  int i;
  ulong __n_00;
  
  for (__n_00 = 0;
      __n_00 < (ulong)(((long)(Matrix->
                              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(Matrix->
                             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n_00 = __n_00 + 1) {
    __n = 0;
    while( true ) {
      pvVar1 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::at(Matrix,__n_00);
      if ((ulong)((long)(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_start) <= __n) break;
      pvVar1 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::at(Matrix,__n_00);
      pvVar2 = std::vector<char,_std::allocator<char>_>::at(pvVar1,__n);
      poVar3 = std::operator<<((ostream *)&std::cout,*pvVar2);
      std::operator<<(poVar3," ");
      __n = __n + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void Maze::printMatrix(std::vector<std::vector<char>> Matrix) {
    //prints the maze

    for(int i = 0; i < Matrix.size(); i++){
        for(int j = 0; j < Matrix.at(i).size(); j++){
            std::cout<< Matrix.at(i).at(j)<<" ";
        }
        std::cout<< std::endl;
    }

}